

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-spoil.c
# Opt level: O0

uint32_t parse_seed(char *src)

{
  _Bool _Var1;
  ang_file *f;
  int *piVar2;
  ulong uVar3;
  unsigned_long ulv;
  char *pe;
  char *s;
  char buf [256];
  ang_file *fin;
  uint32_t result;
  char *src_local;
  
  fin._4_4_ = 0;
  f = file_open(src,MODE_READ,0xffffffff);
  if (f != (ang_file *)0x0) {
    _Var1 = file_getl(f,(char *)&s,0x100);
    if ((_Var1) && (pe = my_stristr((char *)&s,"seed "), pe != (char *)0x0)) {
      piVar2 = __errno_location();
      *piVar2 = 0;
      uVar3 = strtoul(pe + 5,(char **)&ulv,0x10);
      if (((char *)ulv != pe + 5) &&
         (((uVar3 != 0xffffffffffffffff || (piVar2 = __errno_location(), *piVar2 == 0)) &&
          (uVar3 < 0x100000000)))) {
        fin._4_4_ = (uint32_t)uVar3;
      }
    }
    file_close(f);
  }
  return fin._4_4_;
}

Assistant:

static uint32_t parse_seed(const char *src)
{
	uint32_t result = 0;
	ang_file *fin = file_open(src, MODE_READ, -1);

	if (fin) {
		char buf[256];
		char *s;

		if (file_getl(fin, buf, sizeof(buf)) &&
				(s = my_stristr(buf, "seed "))) {
			char *pe;
			unsigned long ulv;

			errno = 0;
			ulv = strtoul(s + 5, &pe, 16);
			if (pe != s + 5 && (ulv < ULONG_MAX || errno == 0)
					&& ulv <= 4294967295) {
				result = (uint32_t)ulv;
			}
		}
		(void) file_close(fin);
	}
	return result;
}